

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void goodform::json::stringify_array(any *v,ostream *output)

{
  bool bVar1;
  vector<std::any,_std::allocator<std::any>_> *pvVar2;
  reference v_00;
  __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_> local_30;
  __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_> local_28;
  __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_> local_20;
  const_iterator it;
  ostream *output_local;
  any *v_local;
  
  it._M_current = (any *)output;
  std::operator<<(output,"[");
  pvVar2 = get<std::vector<std::any,std::allocator<std::any>>>(v);
  local_20._M_current = (any *)std::vector<std::any,_std::allocator<std::any>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = get<std::vector<std::any,std::allocator<std::any>>>(v);
    local_28._M_current = (any *)std::vector<std::any,_std::allocator<std::any>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pvVar2 = get<std::vector<std::any,std::allocator<std::any>>>(v);
    local_30._M_current = (any *)std::vector<std::any,_std::allocator<std::any>_>::begin(pvVar2);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (bVar1) {
      std::operator<<((ostream *)it._M_current,",");
    }
    v_00 = __gnu_cxx::
           __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_>::
           operator*(&local_20);
    serialize(v_00,(ostream *)it._M_current);
    __gnu_cxx::
    __normal_iterator<const_std::any_*,_std::vector<std::any,_std::allocator<std::any>_>_>::
    operator++(&local_20);
  }
  std::operator<<((ostream *)it._M_current,"]");
  return;
}

Assistant:

void json::stringify_array(const any& v, std::ostream& output)
  {
    output << "[";
    for (auto it = get<goodform::array_t>(v).begin(); it != get<goodform::array_t>(v).end(); ++it)
    {

      if (it != get<goodform::array_t>(v).begin())
        output << ",";
      serialize(*it, output);
    }
    output << "]";
  }